

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void alphargbblend_argb32
               (quint32 *dst,uint coverage,QRgba64 *srcLinear,quint32 src,QColorTrcLut *colorProfile
               )

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QRgb QVar4;
  QRgb in_ECX;
  QRgba64 *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QRgba64 s64;
  QRgb s_1;
  QRgb s;
  undefined8 in_stack_ffffffffffffff98;
  uint src_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  QRgba64 in_stack_ffffffffffffffe8;
  
  src_00 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI != 0xff000000) {
    if ((in_ESI == 0xffffffff) && (iVar3 = qAlpha(in_ECX), iVar3 == 0xff)) {
      blend_pixel((quint32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),src_00);
    }
    else if (*in_RDI < 0xff000000) {
      qRgbAvg(in_ECX);
      blend_pixel((quint32 *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),
                  (quint32)((ulong)in_R8 >> 0x20),(int)in_R8);
    }
    else if (in_R8 == 0) {
      QVar4 = *in_RDI;
      blend_pixel((quint32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),src_00);
      QVar4 = rgbBlend(*in_RDI,QVar4,in_ESI);
      *in_RDI = QVar4;
    }
    else {
      bVar2 = QRgba64::isOpaque(in_RDX);
      if (bVar2) {
        rgbBlendPixel((quint32 *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_R8 >> 0x20),(QRgba64)in_RDX->rgba,
                      (QColorTrcLut *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
        ;
      }
      else {
        blend_pixel((quint32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),src_00)
        ;
        if (in_R8 == 0) {
          QRgba64::fromArgb32(src_00);
          iVar3 = (int)((ulong)in_R8 >> 0x20);
        }
        else {
          QColorTrcLut::toLinear64((QColorTrcLut *)srcLinear,src);
          iVar3 = (int)((ulong)in_R8 >> 0x20);
        }
        rgbBlendPixel((quint32 *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),iVar3,
                      in_stack_ffffffffffffffe8,
                      (QColorTrcLut *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void alphargbblend_argb32(quint32 *dst, uint coverage, const QRgba64 &srcLinear, quint32 src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff && qAlpha(src) == 255) {
        blend_pixel(*dst, src);
    } else if (*dst < 0xff000000) {
        // Give up and do a naive gray alphablend. Needed to deal with ARGB32 and invalid ARGB32_premultiplied, see QTBUG-60571
        blend_pixel(*dst, src, qRgbAvg(coverage));
    } else if (!colorProfile) {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then a naive blend with glyph shape
        *dst = rgbBlend(*dst, s, coverage);
    } else if (srcLinear.isOpaque()) {
        rgbBlendPixel(dst, coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        QRgba64 s64 = colorProfile ? colorProfile->toLinear64(s) : QRgba64::fromArgb32(s);
        rgbBlendPixel(dst, coverage, s64, colorProfile);
    }
}